

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deserializer.hpp
# Opt level: O2

unsigned_long __thiscall
duckdb::Deserializer::ReadPropertyWithDefault<unsigned_long>
          (Deserializer *this,field_id_t field_id,char *tag)

{
  uint uVar1;
  int iVar2;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  undefined6 in_register_00000032;
  unsigned_long uVar3;
  
  uVar1 = (*this->_vptr_Deserializer[4])(this,CONCAT62(in_register_00000032,field_id));
  pp_Var4 = this->_vptr_Deserializer;
  if ((char)uVar1 == '\0') {
    uVar3 = 0;
  }
  else {
    iVar2 = (*pp_Var4[0x15])(this);
    uVar3 = CONCAT44(extraout_var,iVar2);
    pp_Var4 = this->_vptr_Deserializer;
  }
  (*pp_Var4[5])(this,(ulong)(uVar1 & 0xff));
  return uVar3;
}

Assistant:

inline T ReadPropertyWithDefault(const field_id_t field_id, const char *tag) {
		if (!OnOptionalPropertyBegin(field_id, tag)) {
			OnOptionalPropertyEnd(false);
			return std::forward<T>(SerializationDefaultValue::GetDefault<T>());
		}
		auto ret = Read<T>();
		OnOptionalPropertyEnd(true);
		return ret;
	}